

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::FreeHeapBlock
          (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  uint32 *puVar1;
  
  SmallHeapBlockT<SmallAllocationBlockAttributes>::Reset
            (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
  (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next =
       &this->emptyBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
  this->emptyBlockList = heapBlock;
  puVar1 = &(this->super_HeapBucket).emptyHeapBlockCount;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::FreeHeapBlock(TBlockType * heapBlock)
{
    heapBlock->Reset();
    heapBlock->SetNextBlock(emptyBlockList);
    emptyBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    this->emptyHeapBlockCount++;
#endif
}